

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_decoder.cc
# Opt level: O0

Status * __thiscall
draco::ObjDecoder::DecodeFromFile(ObjDecoder *this,string *file_name,PointCloud *out_point_cloud)

{
  undefined1 uVar1;
  DecoderBuffer *this_00;
  undefined8 in_RCX;
  string *in_RDX;
  long in_RSI;
  Status *in_RDI;
  vector<char,_std::allocator<char>_> buffer;
  ObjDecoder *in_stack_00000518;
  undefined8 in_stack_ffffffffffffff48;
  Code code;
  vector<char,_std::allocator<char>_> *this_01;
  Status *in_stack_ffffffffffffff50;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  Status *file_name_00;
  allocator<char> *__a;
  undefined7 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  string local_68 [48];
  vector<char,_std::allocator<char>_> local_38;
  undefined8 local_20;
  string *local_18;
  
  code = (Code)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  __a = (allocator<char> *)&local_38;
  file_name_00 = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x114803);
  uVar1 = ReadFileToBuffer((string *)file_name_00,in_stack_ffffffffffffff60);
  if ((bool)uVar1) {
    this_00 = (DecoderBuffer *)(in_RSI + 0x100);
    this_01 = &local_38;
    std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0x1148f2);
    std::vector<char,_std::allocator<char>_>::size(this_01);
    DecoderBuffer::Init(this_00,(char *)this_01,0x114912);
    *(undefined8 *)(in_RSI + 0x140) = local_20;
    std::__cxx11::string::operator=((string *)(in_RSI + 0x60),local_18);
    DecodeInternal(in_stack_00000518);
  }
  else {
    in_stack_ffffffffffffff60 = (vector<char,_std::allocator<char>_> *)&stack0xffffffffffffff97;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)CONCAT17(uVar1,in_stack_ffffffffffffff88),__a);
    Status::Status(in_stack_ffffffffffffff50,code,(string *)0x114864);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  }
  std::vector<char,_std::allocator<char>_>::~vector(in_stack_ffffffffffffff60);
  return in_RDI;
}

Assistant:

Status ObjDecoder::DecodeFromFile(const std::string &file_name,
                                  PointCloud *out_point_cloud) {
  std::vector<char> buffer;
  if (!ReadFileToBuffer(file_name, &buffer)) {
    return Status(Status::DRACO_ERROR, "Unable to read input file.");
  }
  buffer_.Init(buffer.data(), buffer.size());

  out_point_cloud_ = out_point_cloud;
  input_file_name_ = file_name;
  return DecodeInternal();
}